

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeep_Test::
~Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeep_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeep_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceFromTwoLevelsDeep)
{
    libcellml::ImporterPtr importer;
    libcellml::ModelPtr model;

    setupFlattenImportedUnits(importer, model, "");

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(2), flatModel->unitsCount());
    EXPECT_EQ("per_fmol", flatModel->units(0)->name());
    EXPECT_EQ("fmol", flatModel->units(1)->name());
}